

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coptccal.cpp
# Opt level: O0

void __thiscall
icu_63::CopticCalendar::handleComputeFields
          (CopticCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  int jdEpochOffset;
  int32_t local_34;
  uint local_30;
  int32_t year;
  int32_t era;
  int32_t day;
  int32_t month;
  int32_t eyear;
  UErrorCode *param_2_local;
  CopticCalendar *pCStack_10;
  int32_t julianDay_local;
  CopticCalendar *this_local;
  
  _month = param_2;
  param_2_local._4_4_ = julianDay;
  pCStack_10 = this;
  jdEpochOffset = (*(this->super_CECalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  CECalendar::jdToCE(julianDay,jdEpochOffset,&day,&era,&year);
  if (0 < day) {
    local_34 = day;
  }
  else {
    local_34 = 1 - day;
  }
  local_30 = (uint)(0 < day);
  Calendar::internalSet((Calendar *)this,UCAL_EXTENDED_YEAR,day);
  Calendar::internalSet((Calendar *)this,UCAL_ERA,local_30);
  Calendar::internalSet((Calendar *)this,UCAL_YEAR,local_34);
  Calendar::internalSet((Calendar *)this,UCAL_MONTH,era);
  Calendar::internalSet((Calendar *)this,UCAL_DATE,year);
  Calendar::internalSet((Calendar *)this,UCAL_DAY_OF_YEAR,era * 0x1e + year);
  return;
}

Assistant:

void
CopticCalendar::handleComputeFields(int32_t julianDay, UErrorCode &/*status*/)
{
    int32_t eyear, month, day, era, year;
    jdToCE(julianDay, getJDEpochOffset(), eyear, month, day);

    if (eyear <= 0) {
        era = BCE;
        year = 1 - eyear;
    } else {
        era = CE;
        year = eyear;
    }

    internalSet(UCAL_EXTENDED_YEAR, eyear);
    internalSet(UCAL_ERA, era);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DATE, day);
    internalSet(UCAL_DAY_OF_YEAR, (30 * month) + day);
}